

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool medit_damtype(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  bool bVar3;
  char *txt;
  
  if (*argument == '\0') {
    send_to_char("Syntax:  damtype [damage message]\n\r",ch);
    txt = "Para ver una lista de tipos de mensajes, pon \'? weapon\'.\n\r";
  }
  else {
    pvVar1 = ch->desc->pEdit;
    iVar2 = flag_value(weapon_flags,argument);
    if (iVar2 != -99) {
      *(short *)((long)pvVar1 + 0xb8) = (short)iVar2;
      bVar3 = true;
      txt = "Damage type set.\n\r";
      goto LAB_00367556;
    }
    txt = "MEdit: No such damage type.\n\r";
  }
  bVar3 = false;
LAB_00367556:
  send_to_char(txt,ch);
  return bVar3;
}

Assistant:

bool medit_damtype(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int value = NO_FLAG;

	EDIT_MOB(ch, pMob);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  damtype [damage message]\n\r", ch);
		send_to_char("Para ver una lista de tipos de mensajes, pon '? weapon'.\n\r", ch);
		return false;
	}

	value = flag_value(weapon_flags, argument);

	if (value != NO_FLAG)
	{
		pMob->dam_type = value;
		send_to_char("Damage type set.\n\r", ch);
		return true;
	}

	send_to_char("MEdit: No such damage type.\n\r", ch);
	return false;
}